

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O0

void __thiscall
Assimp::ValidateDSProcess::Validate
          (ValidateDSProcess *this,aiAnimation *pAnimation,aiMeshMorphAnim *pMeshMorphAnim)

{
  uint local_2c;
  double dStack_28;
  uint i;
  double dLast;
  aiMeshMorphAnim *pMeshMorphAnim_local;
  aiAnimation *pAnimation_local;
  ValidateDSProcess *this_local;
  
  Validate(this,&pMeshMorphAnim->mName);
  if (pMeshMorphAnim->mNumKeys == 0) {
    ReportError(this,"Empty mesh morph animation channel");
  }
  if (pMeshMorphAnim->mNumKeys != 0) {
    if (pMeshMorphAnim->mKeys == (aiMeshMorphKey *)0x0) {
      ReportError(this,"aiMeshMorphAnim::mKeys is NULL (aiMeshMorphAnim::mNumKeys is %i)",
                  (ulong)pMeshMorphAnim->mNumKeys);
    }
    dStack_28 = -100000000000.0;
    for (local_2c = 0; local_2c < pMeshMorphAnim->mNumKeys; local_2c = local_2c + 1) {
      if ((0.0 < pAnimation->mDuration) &&
         (pAnimation->mDuration + 0.001 < pMeshMorphAnim->mKeys[local_2c].mTime)) {
        ReportError(this,
                    "aiMeshMorphAnim::mKeys[%i].mTime (%.5f) is larger than aiAnimation::mDuration (which is %.5f)"
                    ,(double)(float)pMeshMorphAnim->mKeys[local_2c].mTime,
                    (double)(float)pAnimation->mDuration,(ulong)local_2c);
      }
      if ((local_2c != 0) && (pMeshMorphAnim->mKeys[local_2c].mTime <= dStack_28)) {
        ReportWarning(this,
                      "aiMeshMorphAnim::mKeys[%i].mTime (%.5f) is smaller than aiMeshMorphAnim::mKeys[%i] (which is %.5f)"
                      ,(double)(float)pMeshMorphAnim->mKeys[local_2c].mTime,(ulong)local_2c,
                      (ulong)(local_2c - 1));
      }
      dStack_28 = pMeshMorphAnim->mKeys[local_2c].mTime;
    }
  }
  return;
}

Assistant:

void ValidateDSProcess::Validate( const aiAnimation* pAnimation,
     const aiMeshMorphAnim* pMeshMorphAnim)
{
    Validate(&pMeshMorphAnim->mName);

    if (!pMeshMorphAnim->mNumKeys) {
        ReportError("Empty mesh morph animation channel");
    }

    // otherwise check whether one of the keys exceeds the total duration of the animation
    if (pMeshMorphAnim->mNumKeys)
    {
        if (!pMeshMorphAnim->mKeys)
        {
            ReportError("aiMeshMorphAnim::mKeys is NULL (aiMeshMorphAnim::mNumKeys is %i)",
                pMeshMorphAnim->mNumKeys);
        }
        double dLast = -10e10;
        for (unsigned int i = 0; i < pMeshMorphAnim->mNumKeys;++i)
        {
            // ScenePreprocessor will compute the duration if still the default value
            // (Aramis) Add small epsilon, comparison tended to fail if max_time == duration,
            //  seems to be due the compilers register usage/width.
            if (pAnimation->mDuration > 0. && pMeshMorphAnim->mKeys[i].mTime > pAnimation->mDuration+0.001)
            {
                ReportError("aiMeshMorphAnim::mKeys[%i].mTime (%.5f) is larger "
                    "than aiAnimation::mDuration (which is %.5f)",i,
                    (float)pMeshMorphAnim->mKeys[i].mTime,
                    (float)pAnimation->mDuration);
            }
            if (i && pMeshMorphAnim->mKeys[i].mTime <= dLast)
            {
                ReportWarning("aiMeshMorphAnim::mKeys[%i].mTime (%.5f) is smaller "
                    "than aiMeshMorphAnim::mKeys[%i] (which is %.5f)",i,
                    (float)pMeshMorphAnim->mKeys[i].mTime,
                    i-1, (float)dLast);
            }
            dLast = pMeshMorphAnim->mKeys[i].mTime;
        }
    }
}